

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::computeNewDt
          (NavierStokesBase *this,int finest_level,int param_2,
          Vector<int,_std::allocator<int>_> *n_cycle,
          Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *param_4,
          Vector<double,_std::allocator<double>_> *dt_min,
          Vector<double,_std::allocator<double>_> *dt_level,Real stop_time,int post_regrid_flag)

{
  pointer piVar1;
  NavierStokesBase *pNVar2;
  ostream *poVar3;
  Print *pPVar4;
  pointer pdVar5;
  pointer pdVar6;
  int iVar7;
  long lVar8;
  ostringstream *this_00;
  long lVar9;
  long lVar10;
  double extraout_XMM0_Qa;
  double dVar11;
  Real RVar12;
  double dVar13;
  Print local_1b8;
  
  if ((this->super_AmrLevel).level < 1) {
    lVar10 = (long)finest_level;
    for (lVar8 = 0; lVar8 <= lVar10; lVar8 = lVar8 + 1) {
      pNVar2 = getLevel(this,(int)lVar8);
      pdVar5 = (dt_min->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      (*(pNVar2->super_AmrLevel)._vptr_AmrLevel[0x31])(pNVar2);
      dVar13 = pdVar5[lVar8];
      dVar11 = extraout_XMM0_Qa;
      if (dVar13 <= extraout_XMM0_Qa) {
        dVar11 = dVar13;
      }
      (dt_min->super_vector<double,_std::allocator<double>_>).
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [lVar8] = dVar11;
    }
    if (fixed_dt <= 0.0) {
      if (post_regrid_flag == 1) {
        pdVar5 = (dt_min->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar6 = (dt_level->super_vector<double,_std::allocator<double>_>).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        for (lVar8 = 0; lVar8 <= lVar10; lVar8 = lVar8 + 1) {
          dVar13 = pdVar6[lVar8];
          dVar11 = pdVar5[lVar8];
          if (dVar11 <= dVar13) {
            dVar13 = dVar11;
          }
          pdVar5[lVar8] = dVar13;
        }
      }
      else {
        lVar8 = 0;
        for (lVar9 = 0; this_00 = &local_1b8.ss, lVar9 <= lVar10; lVar9 = lVar9 + 1) {
          pdVar5 = (dt_min->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (dt_level->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((verbose != 0) &&
             (*(double *)((long)pdVar6 + lVar8) * change_max < *(double *)((long)pdVar5 + lVar8))) {
            poVar3 = amrex::OutStream();
            amrex::Print::Print(&local_1b8,poVar3);
            std::operator<<((ostream *)this_00,
                            "NavierStokesBase::compute_new_dt : limiting dt at level ");
            std::ostream::operator<<(this_00,(int)lVar9);
            std::operator<<((ostream *)this_00,'\n');
            amrex::Print::~Print(&local_1b8);
            poVar3 = amrex::OutStream();
            amrex::Print::Print(&local_1b8,poVar3);
            std::operator<<((ostream *)&local_1b8.ss," ... new dt computed: ");
            pPVar4 = amrex::Print::operator<<
                               (&local_1b8,
                                (double *)
                                ((long)(dt_min->super_vector<double,_std::allocator<double>_>).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar8));
            std::operator<<((ostream *)&pPVar4->ss,'\n');
            amrex::Print::~Print(&local_1b8);
            poVar3 = amrex::OutStream();
            amrex::Print::Print(&local_1b8,poVar3);
            std::operator<<((ostream *)&local_1b8.ss," ... but limiting to: ");
            std::ostream::_M_insert<double>
                      (change_max *
                       *(double *)
                        ((long)(dt_level->super_vector<double,_std::allocator<double>_>).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar8));
            std::operator<<((ostream *)&local_1b8.ss," = ");
            pPVar4 = amrex::Print::operator<<(&local_1b8,&change_max);
            std::operator<<((ostream *)&pPVar4->ss," * ");
            pPVar4 = amrex::Print::operator<<
                               (pPVar4,(double *)
                                       ((long)(dt_level->
                                              super_vector<double,_std::allocator<double>_>).
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar8));
            std::operator<<((ostream *)&pPVar4->ss,'\n');
            amrex::Print::~Print(&local_1b8);
            pdVar5 = (dt_min->super_vector<double,_std::allocator<double>_>).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar6 = (dt_level->super_vector<double,_std::allocator<double>_>).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          }
          dVar13 = change_max * *(double *)((long)pdVar6 + lVar8);
          if (*(double *)((long)pdVar5 + lVar8) <= dVar13) {
            dVar13 = *(double *)((long)pdVar5 + lVar8);
          }
          *(double *)((long)pdVar5 + lVar8) = dVar13;
          lVar8 = lVar8 + 8;
        }
      }
    }
    iVar7 = 1;
    dVar13 = 1e+100;
    for (lVar8 = 0; lVar8 <= lVar10; lVar8 = lVar8 + 1) {
      iVar7 = iVar7 * (n_cycle->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[lVar8];
      dVar11 = (double)iVar7 *
               (dt_min->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar8];
      if (dVar13 <= dVar11) {
        dVar11 = dVar13;
      }
      dVar13 = dVar11;
    }
    RVar12 = amrex::StateData::curTime
                       ((this->super_AmrLevel).state.
                        super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    if ((0.0 <= stop_time) && (dVar13 * -0.0001 + stop_time < dVar13 + RVar12)) {
      dVar13 = stop_time - RVar12;
    }
    piVar1 = (n_cycle->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    pdVar5 = (dt_level->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    iVar7 = 1;
    for (lVar8 = 0; lVar8 <= lVar10; lVar8 = lVar8 + 1) {
      iVar7 = iVar7 * piVar1[lVar8];
      pdVar5[lVar8] = dVar13 / (double)iVar7;
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::computeNewDt (int                   finest_level,
				int                   /*sub_cycle*/,
				Vector<int>&           n_cycle,
				const Vector<IntVect>& /*ref_ratio*/,
				Vector<Real>&          dt_min,
				Vector<Real>&          dt_level,
				Real                  stop_time,
				int                   post_regrid_flag)
{
    //
    // We are at the start of a coarse grid timecycle.
    // Compute the timesteps for the next iteration.
    //
    if (level > 0)
        return;

    int i;

    Real dt_0     = 1.0e+100;
    int  n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        NavierStokesBase& adv_level = getLevel(i);
        dt_min[i] = std::min(dt_min[i],adv_level.estTimeStep());
    }

    if (fixed_dt <= 0.0)
    {
       if (post_regrid_flag == 1)
       {
          //
          // Limit dt's by pre-regrid dt
          //
          for (i = 0; i <= finest_level; i++)
          {
              dt_min[i] = std::min(dt_min[i],dt_level[i]);
          }
       }
       else
       {
          //
          // Limit dt's by change_max * old dt
          //
          for (i = 0; i <= finest_level; i++)
          {
	    if (verbose)
                 if (dt_min[i] > change_max*dt_level[i])
                 {
                     amrex::Print() << "NavierStokesBase::compute_new_dt : limiting dt at level "
				    << i << '\n';
                     amrex::Print() << " ... new dt computed: " << dt_min[i]
				    << '\n';
                     amrex::Print() << " ... but limiting to: "
				    << change_max * dt_level[i] << " = " << change_max
				    << " * " << dt_level[i] << '\n';
                 }
             dt_min[i] = std::min(dt_min[i],change_max*dt_level[i]);
          }
       }
    }

    //
    // Find the minimum over all levels
    //
    for (i = 0; i <= finest_level; i++)
    {
        n_factor *= n_cycle[i];
        dt_0      = std::min(dt_0,n_factor*dt_min[i]);
    }

    //
    // Limit dt's by the value of stop_time.
    //
    const Real eps      = 0.0001*dt_0;
    const Real cur_time = state[State_Type].curTime();
    if (stop_time >= 0.0)
    {
        if ((cur_time + dt_0) > (stop_time - eps))
            dt_0 = stop_time - cur_time;
    }

    //
    // Set dt at each level of refinement
    //
    n_factor = 1;
    for (i = 0; i <= finest_level; i++)
    {
        n_factor   *= n_cycle[i];
        dt_level[i] = dt_0/( (Real)n_factor );
    }
}